

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_MacProjector.cpp
# Opt level: O2

void __thiscall
Hydro::MacProjector::setEBInflowVelocity(MacProjector *this,int amrlev,MultiFab *eb_vel)

{
  pointer puVar1;
  tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> tVar2;
  tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> tVar3;
  tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> local_50;
  undefined1 local_48 [48];
  
  if ((_Head_base<0UL,_amrex::MultiFab_*,_false>)
      *(_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)
       &(this->m_eb_vel).
        super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
        .
        super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[amrlev]._M_t.
        super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> ==
      (MultiFab *)0x0) {
    local_48._4_4_ = (eb_vel->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp;
    local_48._0_4_ = (eb_vel->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0];
    local_48._8_8_ = (Arena *)0x1;
    local_48._16_8_ = (pointer)0x0;
    local_48._24_8_ = (pointer)0x0;
    local_48._32_8_ = (pointer)0x0;
    local_48._40_8_ = 0;
    std::
    make_unique<amrex::MultiFab,amrex::BoxArray_const&,amrex::DistributionMapping_const&,int,int,amrex::MFInfo,amrex::FabFactory<amrex::FArrayBox>const&>
              ((BoxArray *)&local_50,
               (DistributionMapping *)
               &(eb_vel->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,
               (int *)&(eb_vel->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap
               ,(int *)(local_48 + 4),(MFInfo *)local_48,
               (FabFactory<amrex::FArrayBox> *)(local_48 + 8));
    tVar3.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         local_50.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
         super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
    puVar1 = (this->m_eb_vel).
             super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_50.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)
         (_Head_base<0UL,_amrex::MultiFab_*,_false>)0x0;
    tVar2.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         *(_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)
          &puVar1[amrlev]._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    puVar1[amrlev]._M_t.
    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> =
         (__uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>)
         tVar3.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
         super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
    if (tVar2.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl !=
        (_Head_base<0UL,_amrex::MultiFab_*,_false>)0x0) {
      (**(code **)(*(long *)tVar2.
                            super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                            .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 8))();
    }
    if (local_50.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl !=
        (_Head_base<0UL,_amrex::MultiFab_*,_false>)0x0) {
      (**(code **)(*(long *)local_50.
                            super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                            .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 8))();
    }
    local_50.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)
         (_Head_base<0UL,_amrex::MultiFab_*,_false>)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_48 + 0x18));
    amrex::MultiFab::Copy
              ((MultiFab *)
               (this->m_eb_vel).
               super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[amrlev]._M_t.
               super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,eb_vel,
               0,0,(eb_vel->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp,
               (eb_vel->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0]);
  }
  return;
}

Assistant:

void MacProjector::setEBInflowVelocity (int amrlev, const MultiFab& eb_vel)
{

    if (m_eb_vel[amrlev] == nullptr) {
      m_eb_vel[amrlev] = std::make_unique<MultiFab>(eb_vel.boxArray(),
            eb_vel.DistributionMap(), eb_vel.nComp(), eb_vel.nGrow(), MFInfo(), eb_vel.Factory());
      MultiFab::Copy(*m_eb_vel[amrlev], eb_vel, 0, 0, eb_vel.nComp(), eb_vel.nGrow());
    }
}